

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O2

string * Tools::substring(string *__return_storage_ptr__,string *s,size_t begin,size_t end)

{
  invalid_argument *this;
  
  if (begin <= end) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10,s,begin,end - begin);
  std::invalid_argument::invalid_argument(this,"\'begin\' can\'t be larger than \'end\'");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string Tools::substring(string s, size_t begin, size_t end) {
    if (begin > end) throw std::invalid_argument("'begin' can't be larger than 'end'");
    try {
        return s.substr(begin, end - begin);
    }
    catch (std::out_of_range &range_error) {
        return "";
    }
}